

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects-info.c
# Opt level: O0

void add_to_summaries(effect_object_property **summaries,int idx,int reslevel_min,int reslevel_max,
                     effect_object_property_kind kind)

{
  effect_object_property *peVar1;
  effect_object_property *prop;
  effect_object_property_kind kind_local;
  int reslevel_max_local;
  int reslevel_min_local;
  int idx_local;
  effect_object_property **summaries_local;
  
  peVar1 = (effect_object_property *)mem_alloc(0x18);
  peVar1->next = *summaries;
  peVar1->idx = idx;
  peVar1->reslevel_min = reslevel_min;
  peVar1->reslevel_max = reslevel_max;
  peVar1->kind = kind;
  *summaries = peVar1;
  return;
}

Assistant:

static void add_to_summaries(struct effect_object_property **summaries,
		int idx, int reslevel_min, int reslevel_max,
		enum effect_object_property_kind kind)
{
	struct effect_object_property *prop = mem_alloc(sizeof(*prop));

	prop->next = *summaries;
	prop->idx = idx;
	prop->reslevel_min = reslevel_min;
	prop->reslevel_max = reslevel_max;
	prop->kind = kind;
	*summaries = prop;
}